

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall haVoc::QMoveorder::next_phase(QMoveorder *this)

{
  bool bVar1;
  element_type *peVar2;
  Score local_18 [2];
  QMoveorder *local_10;
  QMoveorder *this_local;
  
  if (((((*(int *)&(this->super_Moveorder).field_0x64 == 0) ||
        (*(int *)&(this->super_Moveorder).field_0x64 == 1)) ||
       (*(int *)&(this->super_Moveorder).field_0x64 == 2)) ||
      ((*(int *)&(this->super_Moveorder).field_0x64 == 5 ||
       (*(int *)&(this->super_Moveorder).field_0x64 == 6)))) ||
     ((*(int *)&(this->super_Moveorder).field_0x64 == 3 ||
      (*(int *)&(this->super_Moveorder).field_0x64 == 8)))) {
    *(int *)&(this->super_Moveorder).field_0x64 = *(int *)&(this->super_Moveorder).field_0x64 + 1;
  }
  else {
    local_10 = this;
    if ((*(int *)&(this->super_Moveorder).field_0x64 == 4) ||
       (*(int *)&(this->super_Moveorder).field_0x64 == 7)) {
      peVar2 = std::
               __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Moveorder).m_captures);
      bVar1 = ScoredMoves::end(peVar2);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_Moveorder).m_captures);
        local_18[1] = 0xffffd8f0;
        ScoredMoves::create_chunk(peVar2,local_18 + 1);
        *(int *)&(this->super_Moveorder).field_0x64 =
             *(int *)&(this->super_Moveorder).field_0x64 + 1;
        return;
      }
    }
    if ((*(int *)&(this->super_Moveorder).field_0x64 == 9) ||
       (*(int *)&(this->super_Moveorder).field_0x64 == 10)) {
      peVar2 = std::
               __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Moveorder).m_quiets);
      bVar1 = ScoredMoves::end(peVar2);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_Moveorder).m_quiets);
        local_18[0] = ninf;
        ScoredMoves::create_chunk(peVar2,local_18);
        *(int *)&(this->super_Moveorder).field_0x64 =
             *(int *)&(this->super_Moveorder).field_0x64 + 1;
      }
    }
  }
  return;
}

Assistant:

void QMoveorder::next_phase() {
		if ((m_phase == HashMove) ||
			(m_phase == MateKiller1) ||
			(m_phase == MateKiller2) ||
			(m_phase == Killer1) ||
			(m_phase == Killer2) ||
			(m_phase == InitCaptures) ||
			(m_phase == InitQuiets))
			m_phase = Phase(m_phase + 1);
		else if ((m_phase == GoodCaptures || m_phase == BadCaptures) && m_captures->end()) {
			m_captures->create_chunk(Score::ninf); // mark bad captures
			m_phase = Phase(m_phase + 1);
		}
		else if ((m_phase == GoodQuiets || m_phase == BadQuiets) && m_quiets->end()) {
			m_quiets->create_chunk(Score::ninf); // mark bad quiet moves
			m_phase = Phase(m_phase + 1);
		}
	}